

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

void __thiscall QSslCertificate::clear(QSslCertificate *this)

{
  _Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
  _Var1;
  uint uVar2;
  QSslCertificatePrivate *this_00;
  
  _Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl =
       (((this->d).d.ptr)->backend)._M_t.
       super___uniq_ptr_impl<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QTlsPrivate::X509Certificate_*,_std::default_delete<QTlsPrivate::X509Certificate>_>
       .super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>;
  if ((_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>._M_head_impl !=
       (X509Certificate *)0x0) &&
     (uVar2 = (**(code **)(*(long *)_Var1.
                                    super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                                    _M_head_impl + 0x18))
                        (_Var1.super__Head_base<0UL,_QTlsPrivate::X509Certificate_*,_false>.
                         _M_head_impl), (uVar2 & 1) == 0)) {
    this_00 = (QSslCertificatePrivate *)operator_new(0x10);
    QSslCertificatePrivate::QSslCertificatePrivate(this_00);
    QExplicitlySharedDataPointer<QSslCertificatePrivate>::reset(&this->d,this_00);
    return;
  }
  return;
}

Assistant:

void QSslCertificate::clear()
{
    if (isNull())
        return;
    d = new QSslCertificatePrivate;
}